

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReduceSumLayerParams::SerializeWithCachedSizes
          (ReduceSumLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  int64 value;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ReduceSumLayerParams *this_local;
  
  iVar2 = axes_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_axes_cached_byte_size_);
  }
  local_20 = 0;
  iVar2 = axes_size(this);
  for (; local_20 < iVar2; local_20 = local_20 + 1) {
    value = axes(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteInt64NoTag(value,output);
  }
  bVar1 = keepdims(this);
  if (bVar1) {
    bVar1 = keepdims(this);
    google::protobuf::internal::WireFormatLite::WriteBool(2,bVar1,output);
  }
  bVar1 = reduceall(this);
  if (bVar1) {
    bVar1 = reduceall(this);
    google::protobuf::internal::WireFormatLite::WriteBool(3,bVar1,output);
  }
  return;
}

Assistant:

void ReduceSumLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ReduceSumLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 axes = 1;
  if (this->axes_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_axes_cached_byte_size_);
  }
  for (int i = 0, n = this->axes_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->axes(i), output);
  }

  // bool keepDims = 2;
  if (this->keepdims() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->keepdims(), output);
  }

  // bool reduceAll = 3;
  if (this->reduceall() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->reduceall(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ReduceSumLayerParams)
}